

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# awssyncer.cc
# Opt level: O0

string * GetEnvironmentVariable(string *__return_storage_ptr__,string *name)

{
  char *pcVar1;
  ostream *poVar2;
  allocator local_21;
  char *local_20;
  char *value;
  string *name_local;
  
  value = (char *)name;
  name_local = __return_storage_ptr__;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  local_20 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    poVar2 = Log();
    poVar2 = std::operator<<(poVar2,"Missing environment variable: ");
    poVar2 = std::operator<<(poVar2,(string *)value);
    std::ostream::operator<<((ostream *)poVar2,std::endl<char,std::char_traits<char>>);
    abort();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetEnvironmentVariable(const std::string& name) {
  const char* value = std::getenv(name.c_str());
  if (value == nullptr) {
    Log() << "Missing environment variable: " << name << std::endl;
    std::abort();
  }
  return value;
}